

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

void compute_ui_entry_values_for_object
               (ui_entry *entry,object *obj,player *p,cached_object_data **cache,int *val,
               int *auxval)

{
  wchar_t element;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  curse_data *pcVar6;
  bool bVar7;
  _Bool _Var8;
  byte bVar9;
  int iVar10;
  cached_object_data *pcVar11;
  bound_object_property *pbVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  long lVar19;
  ui_entry_combiner_state_conflict cst;
  ui_entry_combiner_funcs_conflict combiner;
  byte local_b5;
  int local_9c;
  object *local_98;
  ui_entry_combiner_state local_88;
  int *local_70;
  int *local_68;
  cached_object_data *local_60;
  ui_entry_combiner_funcs local_58;
  curse_data *local_38;
  
  local_88.work = (void *)0x0;
  local_88.accum = 0;
  local_88.accum_aux = 0;
  local_68 = auxval;
  if ((obj == (object *)0x0) || (entry->n_obj_prop == L'\0')) {
    *val = 0x7ffffffe;
    local_88.accum_aux = 0x7ffffffe;
    goto LAB_001e1f34;
  }
  local_70 = val;
  if (*cache == (cached_object_data *)0x0) {
    pcVar11 = (cached_object_data *)mem_alloc(6);
    *cache = pcVar11;
    flag_wipe((bitflag *)pcVar11,6);
    if (p == (player *)0x0) {
      object_flags(obj,(*cache)->f);
    }
    else {
      object_flags_known(obj,(*cache)->f);
    }
  }
  iVar10 = ui_entry_combiner_get_funcs(entry->combiner_index,&local_58);
  if (iVar10 != 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                  ,0x27b,
                  "void compute_ui_entry_values_for_object(const struct ui_entry *, const struct object *, const struct player *, struct cached_object_data **, int *, int *)"
                 );
  }
  pcVar11 = *cache;
  local_38 = obj->curses;
  bVar5 = true;
  local_b5 = 1;
  bVar1 = true;
  local_9c = 0;
  iVar10 = 0;
  bVar3 = false;
  bVar2 = true;
  bVar4 = false;
  local_98 = obj;
  do {
    local_60 = pcVar11;
    if (L'\0' < entry->n_obj_prop) {
      lVar19 = 0xd;
      lVar15 = 0;
      do {
        pbVar12 = entry->obj_props;
        element = *(wchar_t *)((long)pbVar12 + lVar19 + -9);
        bVar9 = *(byte *)((long)&pbVar12->type + lVar19);
        if (bVar9 == 1) {
          bVar7 = true;
          if ((entry->flags & L'\x01') == L'\0') goto LAB_001e1b3b;
        }
        else {
          bVar2 = false;
          bVar7 = bVar4;
LAB_001e1b3b:
          bVar4 = bVar7;
          switch(*(undefined4 *)((long)pbVar12 + lVar19 + -0xd)) {
          case 1:
          case 2:
            if (((p != (player *)0x0) && (p->obj_k->modifiers[element] == 0)) &&
               (local_98->modifiers[element] != 0)) {
LAB_001e1d59:
              if (0 < iVar10) {
                bVar3 = true;
              }
              goto switchD_001e1b59_default;
            }
            uVar16 = (uint)local_98->modifiers[element];
            if (local_98->modifiers[element] == 0) {
              uVar16 = 0;
            }
            else if (*(char *)((long)pbVar12 + lVar19 + -1) == '\x01') {
              uVar16 = *(uint *)((long)pbVar12 + lVar19 + -5);
            }
            uVar18 = uVar16;
            if (bVar9 != 0) {
              bVar1 = false;
              uVar18 = 0;
            }
            if (bVar9 == 0) {
              uVar16 = 0;
            }
            goto LAB_001e1d22;
          case 3:
            if ((p != (player *)0x0) && (_Var8 = object_flag_is_known(p,local_98,element), !_Var8))
            goto LAB_001e1d59;
            _Var8 = flag_has_dbg(local_60->f,6,element,"cache2->f","ind");
            pbVar12 = entry->obj_props;
            uVar16 = 0;
            if ((_Var8) && (uVar16 = 1, *(char *)((long)pbVar12 + lVar19 + -1) == '\x01')) {
              uVar16 = *(uint *)((long)pbVar12 + lVar19 + -5);
            }
            bVar9 = *(byte *)((long)&pbVar12->type + lVar19);
            break;
          case 4:
            if (p != (player *)0x0) {
              _Var8 = object_element_is_known(p,local_98,element);
              if (_Var8) {
                pbVar12 = entry->obj_props;
                goto LAB_001e1c93;
              }
              if (0 < iVar10) {
                bVar3 = true;
              }
LAB_001e1da7:
              local_9c = 100;
              goto switchD_001e1b59_default;
            }
LAB_001e1c93:
            iVar13 = (int)local_98->el_info[element].res_level;
            iVar17 = 100;
            if ((iVar13 != 100) &&
               (iVar17 = iVar13, *(char *)((long)pbVar12 + lVar19 + -1) == '\x01')) {
              iVar17 = *(int *)((long)pbVar12 + lVar19 + -5);
            }
            bVar9 = *(byte *)((long)&pbVar12->type + lVar19);
            local_b5 = local_b5 & bVar9;
            if (bVar9 != 0) {
              bVar1 = false;
            }
            iVar13 = 100;
            if (bVar9 != 0) {
              iVar13 = iVar17;
              iVar17 = 100;
            }
            if (!bVar5) {
              (*local_58.accum_func)(iVar17,iVar13,&local_88);
              goto LAB_001e1da7;
            }
            (*local_58.init_func)(iVar17,iVar13,&local_88);
            local_9c = 100;
            goto LAB_001e1d32;
          case 5:
            if (p != (player *)0x0) {
              _Var8 = object_element_is_known(p,local_98,element);
              if (!_Var8) {
                if (0 < iVar10) {
                  bVar3 = true;
                }
                goto switchD_001e1b59_default;
              }
              pbVar12 = entry->obj_props;
            }
            bVar9 = local_98->el_info[element].flags;
            uVar16 = (bVar9 & 2) >> 1;
            if (((bVar9 & 2) != 0) && (*(char *)((long)pbVar12 + lVar19 + -1) == '\x01')) {
              uVar16 = *(uint *)((long)pbVar12 + lVar19 + -5);
            }
            bVar9 = *(byte *)((long)&pbVar12->type + lVar19);
            break;
          default:
            goto switchD_001e1b59_default;
          }
          uVar18 = uVar16;
          if (bVar9 != 0) {
            uVar18 = 0;
            bVar1 = false;
          }
          if (bVar9 == 0) {
            uVar16 = 0;
          }
LAB_001e1d22:
          local_b5 = local_b5 & bVar9;
          if (bVar5) {
            (*local_58.init_func)(uVar18,uVar16,&local_88);
LAB_001e1d32:
            bVar5 = false;
          }
          else {
            (*local_58.accum_func)(uVar18,uVar16,&local_88);
          }
        }
switchD_001e1b59_default:
        lVar15 = lVar15 + 1;
        lVar19 = lVar19 + 0x10;
      } while (lVar15 < entry->n_obj_prop);
    }
    pcVar6 = local_38;
    if (local_38 == (curse_data *)0x0) break;
    pcVar11 = local_60;
    if (iVar10 == 0) {
      pcVar11 = (cached_object_data *)mem_alloc(6);
    }
    lVar19 = (long)iVar10;
    lVar15 = lVar19 * 7 + 3;
    do {
      lVar14 = lVar15;
      lVar19 = lVar19 + 1;
      if ((long)(ulong)z_info->curse_max <= lVar19) {
        mem_free(pcVar11);
        goto LAB_001e1e87;
      }
      iVar10 = iVar10 + 1;
      lVar15 = lVar14 + 7;
    } while (pcVar6[lVar19].power == L'\0');
    local_98 = *(object **)(curses[1].conflict_flags + lVar14 * 8 + -0x28);
    flag_wipe(pcVar11->f,6);
    if (p == (player *)0x0) {
      object_flags(local_98,pcVar11->f);
    }
    else {
      object_flags_known(local_98,pcVar11->f);
    }
  } while (local_98 != (object *)0x0);
LAB_001e1e87:
  if (local_b5 == 0) {
    (*local_58.finish_func)(&local_88);
    iVar10 = local_88.accum;
    if ((local_88.accum == local_9c) && (iVar10 = local_9c, bVar3)) goto LAB_001e1ef7;
  }
  else {
    if (bVar1) {
      iVar10 = 0x7fffffff;
      if (bVar2) {
        iVar10 = local_9c;
      }
      *local_70 = iVar10;
      local_88.accum_aux = local_9c;
      if (bVar4) {
        local_88.accum_aux = 0x7fffffff;
      }
      goto LAB_001e1f34;
    }
    (*local_58.finish_func)(&local_88);
LAB_001e1ef7:
    iVar10 = 0x7fffffff;
    if (bVar2) {
      iVar10 = local_9c;
    }
  }
  *local_70 = iVar10;
  if (((bVar1) || ((local_88.accum_aux == local_9c && (bVar3)))) &&
     (local_88.accum_aux = local_9c, bVar4)) {
    local_88.accum_aux = 0x7fffffff;
  }
LAB_001e1f34:
  *local_68 = local_88.accum_aux;
  return;
}

Assistant:

void compute_ui_entry_values_for_object(const struct ui_entry *entry,
	const struct object *obj, const struct player *p,
	struct cached_object_data **cache, int *val, int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	const struct curse_data *curse;
	struct cached_object_data *cache2;
	bool first, all_unknown, all_aux_unknown, any_aux, all_aux;
	bool any_curse_unknown;
	int curse_ind;
	int base = 0;

	if (!obj || !entry->n_obj_prop) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		of_wipe((*cache)->f);
		if (p) {
			object_flags_known(obj, (*cache)->f);
		} else {
			object_flags(obj, (*cache)->f);
		}
	}
	first = true;
	all_unknown = true;
	all_aux_unknown = true;
	any_aux = false;
	all_aux = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	cache2 = *cache;
	curse = obj->curses;
	any_curse_unknown = false;
	curse_ind = 0;
	while (obj) {
		int i;

		for (i = 0; i < entry->n_obj_prop; ++i) {
			int ind = entry->obj_props[i].index;

			if (entry->obj_props[i].isaux) {
				if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
					continue;
				}
				any_aux = true;
			} else {
				all_aux = false;
			}

			switch (entry->obj_props[i].type) {
			case OBJ_PROPERTY_STAT:
			case OBJ_PROPERTY_MOD:
				if (!p || p->obj_k->modifiers[ind] != 0 ||
					obj->modifiers[ind] == 0) {
					int v = obj->modifiers[ind];
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_FLAG:
				if (!p || object_flag_is_known(p, obj, ind)) {
					int v = of_has(cache2->f, ind) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_IGNORE:
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = (obj->el_info[ind].flags &
						EL_INFO_IGNORE) ? 1 : 0;
					int a = 0;

					if (v && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			case OBJ_PROPERTY_ELEMENT:
				base = RES_LEVEL_BASE;
				if (!p || object_element_is_known(p, obj, ind)) {
					int v = obj->el_info[ind].res_level;
					int a = RES_LEVEL_BASE;

					if (v != base && entry->obj_props[i].have_value) {
						v = entry->obj_props[i].value;
					}
					if (entry->obj_props[i].isaux) {
						int t = a;

						a = v;
						v = t;
						all_aux_unknown = false;
					} else {
						all_unknown = false;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
				} else if (curse_ind > 0) {
					any_curse_unknown = true;
				}
				break;

			default:
				break;
			}
		}

		if (curse) {
			/*
			 * Proceed to the next unprocessed curse object.
			 * Don't overwrite the cached data for the base.
			 */
			obj = NULL;
			if (curse_ind == 0) {
				cache2 = mem_alloc(sizeof(*cache2));
			}
			++curse_ind;
			while (1) {
				if (curse_ind >= z_info->curse_max) {
					mem_free(cache2);
					break;
				}
				if (curse[curse_ind].power) {
					obj = curses[curse_ind].obj;
					of_wipe(cache2->f);
					if (p) {
						object_flags_known(obj,
							cache2->f);
					} else {
						object_flags(obj, cache2->f);
					}
					break;
				}
				++curse_ind;
			}
		} else {
			obj = NULL;
		}
	}
	if (all_unknown && all_aux_unknown) {
		*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
	} else {
		(*combiner.finish_func)(&cst);
		if (all_unknown || (cst.accum == base && any_curse_unknown)) {
			*val = (all_aux) ? base : UI_ENTRY_UNKNOWN_VALUE;
		} else {
			*val = cst.accum;
		}
		if (all_aux_unknown || (cst.accum_aux == base && any_curse_unknown)) {
			*auxval = (any_aux) ? UI_ENTRY_UNKNOWN_VALUE : base;
		} else {
			*auxval = cst.accum_aux;
		}
	}
}